

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_event_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::msgpack::msgpack_event_reader<jsoncons::bytes_source,_std::allocator<char>_>::read_next
          (msgpack_event_reader<jsoncons::bytes_source,_std::allocator<char>_> *this,error_code *ec)

{
  bool bVar1;
  error_code *in_RSI;
  error_code *in_RDI;
  basic_item_event_receiver<char> *unaff_retaddr;
  error_code *in_stack_00000050;
  item_event_visitor *in_stack_00000058;
  basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_00000060;
  error_code *ec_00;
  
  ec_00 = in_RDI;
  bVar1 = basic_item_event_receiver<char>::in_available
                    ((basic_item_event_receiver<char> *)(in_RDI + 10));
  if (bVar1) {
    basic_item_event_receiver<char>::send_available(unaff_retaddr,ec_00);
  }
  else {
    basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_>::restart
              ((basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_> *)
               &in_RDI->_M_cat);
    do {
      bVar1 = basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_>::stopped
                        ((basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_> *)
                         &in_RDI->_M_cat);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        return;
      }
      basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_>::parse
                (in_stack_00000060,in_stack_00000058,in_stack_00000050);
      bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
    } while (!bVar1);
  }
  return;
}

Assistant:

void read_next(std::error_code& ec)
        {
            if (cursor_visitor_.in_available())
            {
                cursor_visitor_.send_available(ec);
            }
            else
            {
                parser_.restart();
                while (!parser_.stopped())
                {
                    parser_.parse(cursor_visitor_, ec);
                    if (JSONCONS_UNLIKELY(ec)) {return;}
                }
            }
        }